

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void string_process_escapes(string *input)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  long lVar7;
  char x [3];
  char *err_p;
  char local_3b;
  char local_3a;
  char local_39;
  char *local_38;
  ulong uVar6;
  
  uVar2 = input->_M_string_length;
  if (uVar2 == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    uVar5 = 0;
    do {
      pcVar3 = (input->_M_dataplus)._M_p;
      if ((pcVar3[uVar5] == '\\') && (uVar6 = uVar5 + 1, uVar6 < uVar2)) {
        bVar1 = pcVar3[uVar6];
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x22) {
            pcVar3[lVar7] = '\"';
          }
          else if (bVar1 == 0x27) {
            pcVar3[lVar7] = '\'';
          }
          else {
            if (bVar1 != 0x5c) goto LAB_001fb1df;
            pcVar3[lVar7] = '\\';
          }
        }
        else if (bVar1 < 0x74) {
          if (bVar1 == 0x6e) {
            pcVar3[lVar7] = '\n';
          }
          else {
            if (bVar1 != 0x72) goto LAB_001fb1df;
            pcVar3[lVar7] = '\r';
          }
        }
        else {
          if (bVar1 != 0x74) {
            if ((bVar1 == 0x78) && (uVar5 + 3 < uVar2)) {
              local_3b = pcVar3[uVar5 + 2];
              local_3a = pcVar3[uVar5 + 3];
              local_39 = '\0';
              local_38 = (char *)0x0;
              lVar4 = strtol(&local_3b,&local_38,0x10);
              if (local_38 == &local_39) {
                (input->_M_dataplus)._M_p[lVar7] = (char)lVar4;
                lVar7 = lVar7 + 1;
                uVar6 = uVar5 + 3;
                goto LAB_001fb1fa;
              }
            }
LAB_001fb1df:
            (input->_M_dataplus)._M_p[lVar7] = '\\';
            pcVar3 = (input->_M_dataplus)._M_p;
            pcVar3[lVar7 + 1] = pcVar3[uVar6];
            lVar7 = lVar7 + 2;
            goto LAB_001fb1fa;
          }
          pcVar3[lVar7] = '\t';
        }
        lVar7 = lVar7 + 1;
      }
      else {
        pcVar3[lVar7] = pcVar3[uVar5];
        lVar7 = lVar7 + 1;
        uVar6 = uVar5;
      }
LAB_001fb1fa:
      uVar5 = uVar6 + 1;
    } while (uVar5 < uVar2);
  }
  std::__cxx11::string::resize((ulong)input,(char)lVar7);
  return;
}

Assistant:

void string_process_escapes(std::string & input) {
    std::size_t input_len = input.length();
    std::size_t output_idx = 0;

    for (std::size_t input_idx = 0; input_idx < input_len; ++input_idx) {
        if (input[input_idx] == '\\' && input_idx + 1 < input_len) {
            switch (input[++input_idx]) {
                case 'n':  input[output_idx++] = '\n'; break;
                case 'r':  input[output_idx++] = '\r'; break;
                case 't':  input[output_idx++] = '\t'; break;
                case '\'': input[output_idx++] = '\''; break;
                case '\"': input[output_idx++] = '\"'; break;
                case '\\': input[output_idx++] = '\\'; break;
                case 'x':
                    // Handle \x12, etc
                    if (input_idx + 2 < input_len) {
                        const char x[3] = { input[input_idx + 1], input[input_idx + 2], 0 };
                        char *err_p = nullptr;
                        const long val = std::strtol(x, &err_p, 16);
                        if (err_p == x + 2) {
                            input_idx += 2;
                            input[output_idx++] = char(val);
                            break;
                        }
                    }
                    // fall through
                default:   input[output_idx++] = '\\';
                           input[output_idx++] = input[input_idx]; break;
            }
        } else {
            input[output_idx++] = input[input_idx];
        }
    }

    input.resize(output_idx);
}